

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmConditionEvaluator.cxx
# Opt level: O3

bool __thiscall
cmConditionEvaluator::GetBooleanValue(cmConditionEvaluator *this,cmExpandedCommandArgument *arg)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  char *pcVar3;
  double dVar4;
  char *end;
  string local_40;
  
  paVar1 = &local_40.field_2;
  local_40._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"0","");
  bVar2 = cmExpandedCommandArgument::operator==(arg,&local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != paVar1) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  if (!bVar2) {
    local_40._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"1","");
    bVar2 = cmExpandedCommandArgument::operator==(arg,&local_40);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != paVar1) {
      operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
    }
    if (bVar2) {
      return true;
    }
    pcVar3 = cmExpandedCommandArgument::c_str(arg);
    bVar2 = cmSystemTools::IsOn(pcVar3);
    if (bVar2) {
      return true;
    }
    pcVar3 = cmExpandedCommandArgument::c_str(arg);
    bVar2 = cmSystemTools::IsOff(pcVar3);
    if (!bVar2) {
      bVar2 = cmExpandedCommandArgument::empty(arg);
      if (!bVar2) {
        pcVar3 = cmExpandedCommandArgument::c_str(arg);
        dVar4 = strtod(pcVar3,(char **)&local_40);
        if (*local_40._M_dataplus._M_p == '\0') {
          return (bool)(-(dVar4 != 0.0) & 1);
        }
      }
      pcVar3 = GetDefinitionIfUnquoted(this,arg);
      bVar2 = cmSystemTools::IsOff(pcVar3);
      return !bVar2;
    }
  }
  return false;
}

Assistant:

bool cmConditionEvaluator::GetBooleanValue(
  cmExpandedCommandArgument& arg) const
{
  // Check basic constants.
  if (arg == "0") {
    return false;
  }
  if (arg == "1") {
    return true;
  }

  // Check named constants.
  if (cmSystemTools::IsOn(arg.c_str())) {
    return true;
  }
  if (cmSystemTools::IsOff(arg.c_str())) {
    return false;
  }

  // Check for numbers.
  if (!arg.empty()) {
    char* end;
    double d = strtod(arg.c_str(), &end);
    if (*end == '\0') {
      // The whole string is a number.  Use C conversion to bool.
      return static_cast<bool>(d);
    }
  }

  // Check definition.
  const char* def = this->GetDefinitionIfUnquoted(arg);
  return !cmSystemTools::IsOff(def);
}